

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_entry.hxx
# Opt level: O1

ptr<buffer> __thiscall nuraft::log_entry::serialize(log_entry *this)

{
  size_t sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong *in_RSI;
  ptr<buffer> pVar2;
  
  buffer::pos((buffer *)in_RSI[2],0);
  sVar1 = buffer::size((buffer *)in_RSI[2]);
  buffer::alloc((buffer *)this,sVar1 + 9);
  buffer::put((buffer *)this->term_,*in_RSI);
  buffer::put((buffer *)this->term_,(byte)in_RSI[1]);
  buffer::put((buffer *)this->term_,(buffer *)in_RSI[2]);
  buffer::pos((buffer *)this->term_,0);
  pVar2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> serialize() {
        buff_->pos(0);
        ptr<buffer> buf = buffer::alloc( sizeof(ulong) +
                                         sizeof(char) +
                                         buff_->size() );
        buf->put(term_);
        buf->put( (static_cast<byte>(value_type_)) );
        buf->put(*buff_);
        buf->pos(0);
        return buf;
    }